

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1chord_angle.h
# Opt level: O0

void __thiscall S1ChordAngle::S1ChordAngle(S1ChordAngle *this,S2Point *x,S2Point *y)

{
  bool bVar1;
  double *pdVar2;
  ostream *poVar3;
  S2LogMessage local_a8;
  S2LogMessageVoidify local_91;
  D local_90;
  double local_78;
  double local_70;
  byte local_61;
  S2LogMessage local_60;
  S2LogMessageVoidify local_4d [20];
  byte local_39;
  S2LogMessage local_38;
  S2LogMessageVoidify local_21;
  S2Point *local_20;
  S2Point *y_local;
  S2Point *x_local;
  S1ChordAngle *this_local;
  
  local_20 = y;
  y_local = x;
  x_local = (S2Point *)this;
  bVar1 = S2::IsUnitLength(x);
  local_39 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1chord_angle.h"
               ,0xeb,kFatal,(ostream *)&std::cerr);
    local_39 = 1;
    poVar3 = S2LogMessage::stream(&local_38);
    poVar3 = std::operator<<(poVar3,"Check failed: S2::IsUnitLength(x) ");
    S2LogMessageVoidify::operator&(&local_21,poVar3);
  }
  if ((local_39 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_38);
  }
  bVar1 = S2::IsUnitLength(local_20);
  local_61 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_60,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1chord_angle.h"
               ,0xec,kFatal,(ostream *)&std::cerr);
    local_61 = 1;
    poVar3 = S2LogMessage::stream(&local_60);
    poVar3 = std::operator<<(poVar3,"Check failed: S2::IsUnitLength(y) ");
    S2LogMessageVoidify::operator&(local_4d,poVar3);
  }
  if ((local_61 & 1) == 0) {
    local_70 = 4.0;
    util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator-
              (&local_90,(BasicVector<Vector3,_double,_3UL> *)y_local,local_20);
    local_78 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                         ((BasicVector<Vector3,_double,_3UL> *)&local_90);
    pdVar2 = std::min<double>(&local_70,&local_78);
    this->length2_ = *pdVar2;
    bVar1 = is_valid(this);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1chord_angle.h"
                 ,0xf0,kFatal,(ostream *)&std::cerr);
      poVar3 = S2LogMessage::stream(&local_a8);
      poVar3 = std::operator<<(poVar3,"Check failed: is_valid() ");
      S2LogMessageVoidify::operator&(&local_91,poVar3);
      S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_a8);
    }
    return;
  }
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_60);
}

Assistant:

inline S1ChordAngle::S1ChordAngle(const S2Point& x, const S2Point& y) {
  S2_DCHECK(S2::IsUnitLength(x));
  S2_DCHECK(S2::IsUnitLength(y));
  // The squared distance may slightly exceed 4.0 due to roundoff errors.
  // The maximum error in the result is 2 * DBL_EPSILON * length2_.
  length2_ = std::min(4.0, (x - y).Norm2());
  S2_DCHECK(is_valid());
}